

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.h
# Opt level: O2

BufferWithRandomAccess * __thiscall
wasm::BufferWithRandomAccess::operator<<(BufferWithRandomAccess *this,int32_t x)

{
  uchar local_1c;
  uchar local_1b;
  uchar local_1a;
  uchar local_19;
  
  local_1c = (uchar)x;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,&local_1c);
  local_19 = (uchar)((uint)x >> 8);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,&local_19);
  local_1b = (uchar)((uint)x >> 0x10);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,&local_1b);
  local_1a = (uchar)((uint)x >> 0x18);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,&local_1a);
  return this;
}

Assistant:

BufferWithRandomAccess& operator<<(int32_t x) {
    push_back(x & 0xff);
    x >>= 8;
    push_back(x & 0xff);
    x >>= 8;
    push_back(x & 0xff);
    x >>= 8;
    push_back(x & 0xff);
    return *this;
  }